

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctstr_incl(char *str,char *check_incl)

{
  char *pcVar1;
  
  if (str == (char *)0x0) {
    str = "";
  }
  if (check_incl == (char *)0x0) {
    check_incl = "";
  }
  if (str != check_incl) {
    pcVar1 = strstr(str,check_incl);
    return (int)(pcVar1 != (char *)0x0);
  }
  return 1;
}

Assistant:

static int
fctstr_incl(char const *str, char const *check_incl)
{
    static char const *blank_s = "";
    char const *found = NULL;
    if ( str == NULL )
    {
        str = blank_s;
    }
    if ( check_incl == NULL )
    {
        check_incl = blank_s;
    }
    if ( str == check_incl )
    {
        return 1;
    }
    found = strstr(str, check_incl);
    return found != NULL;
}